

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O2

void nn_mutex_init(nn_mutex_t *self)

{
  uint errnum;
  char *pcVar1;
  FILE *__stream;
  undefined8 uStack_30;
  pthread_mutexattr_t attr;
  
  pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
  errnum = pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,2);
  if (errnum == 0) {
    errnum = pthread_mutex_init((pthread_mutex_t *)self,(pthread_mutexattr_t *)0x0);
    if (errnum == 0) {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&attr);
      return;
    }
    nn_backtrace_print();
    __stream = _stderr;
    pcVar1 = nn_err_strerror(errnum);
    uStack_30 = 0x48;
  }
  else {
    nn_backtrace_print();
    __stream = _stderr;
    pcVar1 = nn_err_strerror(errnum);
    uStack_30 = 0x46;
  }
  fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar1,(ulong)errnum,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/mutex.c"
          ,uStack_30);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_mutex_init (nn_mutex_t *self)
{
    int rc;
    pthread_mutexattr_t attr;

    pthread_mutexattr_init(&attr);
    rc = pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_ERRORCHECK);
    errnum_assert (rc == 0, rc);
    rc = pthread_mutex_init (&self->mutex, NULL);
    errnum_assert (rc == 0, rc);
    pthread_mutexattr_destroy(&attr);
}